

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O3

int net_tcp4_listen_socket(char *hostname,unsigned_short port)

{
  int iVar1;
  int s;
  int iVar2;
  uchar ip [4];
  uchar local_1c [4];
  
  iVar1 = net_ip4_resolve_hostname(hostname,port,local_1c,(sockaddr_in *)0x0);
  if (iVar1 == 0) {
    local_1c[0] = '\0';
    local_1c[1] = '\0';
    local_1c[2] = '\0';
    local_1c[3] = '\0';
  }
  s = net_tcp4_nonblock_socket();
  iVar1 = -1;
  if (-1 < s) {
    iVar2 = net_tcp4_bind_reuse(s,local_1c,port);
    if (-1 < iVar2) {
      iVar2 = listen(s,0x10);
      iVar1 = -1;
      if (-1 < iVar2) {
        iVar1 = s;
      }
    }
  }
  return iVar1;
}

Assistant:

int net_tcp4_listen_socket(char *hostname, unsigned short port) {
  unsigned char ip[4];
  if (!net_ip4_resolve_hostname(hostname, port, ip, NULL))
    memset(ip, 0, sizeof(ip));
  
  int sock;
  if (((sock = net_tcp4_nonblock_socket()) < 0) ||
      (net_tcp4_bind_reuse(sock, ip, port) < 0) ||
      (listen(sock, 16) < 0)) {
    return -1;
  }

  return sock;
}